

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swin_block.h
# Opt level: O3

void __thiscall
shift_window_transformer::SwinBlock<float>::~SwinBlock(SwinBlock<float> *this,void **vtt)

{
  void *pvVar1;
  WindowAttention<float> *this_00;
  FeedForward<float> *this_01;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x28)) = vtt[1];
  this_00 = this->windowAttention;
  if (this_00 != (WindowAttention<float> *)0x0) {
    WindowAttention<float>::~WindowAttention(this_00,&WindowAttention<float>::VTT);
    operator_delete(this_00,0x80);
    this->windowAttention = (WindowAttention<float> *)0x0;
  }
  this_01 = this->feedForward;
  if (this_01 != (FeedForward<float> *)0x0) {
    FeedForward<float>::~FeedForward(this_01,&FeedForward<float>::VTT);
    operator_delete(this_01,0x20);
    this->feedForward = (FeedForward<float> *)0x0;
  }
  if (this->preNorm1 != (PreNorm<float> *)0x0) {
    operator_delete(this->preNorm1,0x28);
    this->preNorm1 = (PreNorm<float> *)0x0;
  }
  if (this->preNorm2 != (PreNorm<float> *)0x0) {
    operator_delete(this->preNorm2,0x28);
    this->preNorm2 = (PreNorm<float> *)0x0;
  }
  if (this->residual1 != (Residual<float> *)0x0) {
    operator_delete(this->residual1,0x10);
    this->residual1 = (Residual<float> *)0x0;
  }
  if (this->residual2 != (Residual<float> *)0x0) {
    operator_delete(this->residual2,0x10);
    this->residual2 = (Residual<float> *)0x0;
  }
  return;
}

Assistant:

~SwinBlock() {
            if (windowAttention != nullptr) {
                delete windowAttention;
                windowAttention = nullptr;
            }
            if (feedForward != nullptr) {
                delete feedForward;
                feedForward = nullptr;
            }
            if (preNorm1 != nullptr) {
                delete preNorm1;
                preNorm1 = nullptr;
            }
            if (preNorm2 != nullptr) {
                delete preNorm2;
                preNorm2 = nullptr;
            }
            if (residual1 != nullptr) {
                delete residual1;
                residual1 = nullptr;
            }
            if (residual2 != nullptr) {
                delete residual2;
                residual2 = nullptr;
            }
        }